

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageIO.cpp
# Opt level: O0

void Imf_3_2::saveDeepTiledImage(string *fileName,Header *hdr,DeepImage *img,DataWindowSource dws)

{
  uint xs;
  uint ys;
  bool bVar1;
  byte bVar2;
  LevelMode LVar3;
  LevelRoundingMode LVar4;
  int iVar5;
  int iVar6;
  Attribute *pAVar7;
  uint *puVar8;
  long lVar9;
  undefined4 *puVar10;
  undefined4 extraout_var;
  const_iterator cVar11;
  string *psVar12;
  string *psVar13;
  char *pcVar14;
  Image *in_RDX;
  undefined1 auVar15 [16];
  int x_1;
  int y;
  int x;
  DeepTiledOutputFile out;
  ConstIterator i_1;
  DeepImageLevel *level;
  ConstIterator i;
  Header newHdr;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  undefined8 in_stack_fffffffffffffe58;
  DataWindowSource dws_00;
  Image *in_stack_fffffffffffffe60;
  Header *in_stack_fffffffffffffe68;
  int local_104;
  int local_100;
  int local_fc;
  DeepTiledOutputFile local_f8 [16];
  undefined5 local_e8;
  undefined3 uStack_e3;
  undefined5 local_e0;
  undefined3 uStack_db;
  undefined5 local_d8;
  undefined3 local_d3;
  undefined5 uStack_d0;
  const_iterator local_c8;
  DeepTiledOutputFile *in_stack_ffffffffffffff50;
  TileDescription local_a0;
  TileDescription local_90;
  undefined8 local_80;
  undefined8 local_68;
  Vec2<float> local_60;
  TileDescription local_58 [4];
  Image *local_18;
  DeepImage *img_00;
  
  local_18 = in_RDX;
  Imath_3_2::Vec2<float>::Vec2(&local_60,0.0,0.0);
  Imf_3_2::Header::Header((Header *)0x3f800000,local_58,0x40,0x40,&local_60,0,3);
  local_68 = Imf_3_2::Header::begin();
  while( true ) {
    local_80 = Imf_3_2::Header::end();
    bVar1 = operator!=((ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       (ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    dws_00 = (DataWindowSource)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    if (!bVar1) break;
    pcVar14 = Header::ConstIterator::name((ConstIterator *)0x124d8a);
    iVar5 = strcmp(pcVar14,"dataWindow");
    if (iVar5 != 0) {
      pcVar14 = Header::ConstIterator::name((ConstIterator *)0x124dbe);
      iVar5 = strcmp(pcVar14,"tiles");
      if (iVar5 != 0) {
        pcVar14 = Header::ConstIterator::name((ConstIterator *)0x124df2);
        iVar5 = strcmp(pcVar14,"channels");
        if (iVar5 != 0) {
          pAVar7 = (Attribute *)Header::ConstIterator::name((ConstIterator *)0x124e22);
          Header::ConstIterator::attribute((ConstIterator *)0x124e39);
          Imf_3_2::Header::insert((char *)local_58,pAVar7);
        }
      }
    }
    Header::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  bVar2 = Imf_3_2::Header::hasTileDescription();
  if ((bVar2 & 1) == 0) {
    LVar3 = Image::levelMode(local_18);
    LVar4 = Image::levelRoundingMode(local_18);
    TileDescription::TileDescription(&local_a0,0x40,0x40,LVar3,LVar4);
    Imf_3_2::Header::setTileDescription(local_58);
  }
  else {
    puVar8 = (uint *)Imf_3_2::Header::tileDescription();
    xs = *puVar8;
    lVar9 = Imf_3_2::Header::tileDescription();
    ys = *(uint *)(lVar9 + 4);
    LVar3 = Image::levelMode(local_18);
    LVar4 = Image::levelRoundingMode(local_18);
    TileDescription::TileDescription(&local_90,xs,ys,LVar3,LVar4);
    Imf_3_2::Header::setTileDescription(local_58);
  }
  dataWindowForFile(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,dws_00);
  Imf_3_2::Header::dataWindow();
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator=
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  puVar10 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar10 = 2;
  iVar5 = (*local_18->_vptr_Image[6])(local_18,0);
  img_00 = (DeepImage *)CONCAT44(extraout_var,iVar5);
  cVar11._M_node =
       (_Base_ptr)
       DeepImageLevel::begin
                 ((DeepImageLevel *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  while( true ) {
    local_c8._M_node =
         (_Base_ptr)
         DeepImageLevel::end((DeepImageLevel *)
                             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    bVar1 = operator!=((ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                       (ConstIterator *)
                       CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    if (!bVar1) break;
    psVar12 = (string *)Imf_3_2::Header::channels();
    psVar13 = DeepImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x12510a);
    DeepImageLevel::ConstIterator::channel((ConstIterator *)0x12511e);
    auVar15 = ImageChannel::channel
                        ((ImageChannel *)
                         CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
    local_e8 = auVar15._0_5_;
    uStack_e3 = auVar15._5_3_;
    local_e0 = auVar15._8_5_;
    uStack_db = auVar15._13_3_;
    uStack_d0 = local_e0;
    local_d8 = local_e8;
    local_d3 = uStack_e3;
    Imf_3_2::ChannelList::insert(psVar12,(Channel *)psVar13);
    DeepImageLevel::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  }
  pcVar14 = (char *)std::__cxx11::string::c_str();
  iVar5 = Imf_3_2::globalThreadCount();
  Imf_3_2::DeepTiledOutputFile::DeepTiledOutputFile(local_f8,pcVar14,(Header *)local_58,iVar5);
  LVar3 = Image::levelMode(local_18);
  if (LVar3 == ONE_LEVEL) {
    anon_unknown_30::saveLevel
              (in_stack_ffffffffffffff50,img_00,(int)((ulong)cVar11._M_node >> 0x20),
               (int)cVar11._M_node);
  }
  else if (LVar3 == MIPMAP_LEVELS) {
    for (local_fc = 0; iVar5 = Imf_3_2::DeepTiledOutputFile::numLevels(), local_fc < iVar5;
        local_fc = local_fc + 1) {
      anon_unknown_30::saveLevel
                (in_stack_ffffffffffffff50,img_00,(int)((ulong)cVar11._M_node >> 0x20),
                 (int)cVar11._M_node);
    }
  }
  else if (LVar3 == RIPMAP_LEVELS) {
    local_100 = 0;
    while (iVar5 = local_100, iVar6 = Imf_3_2::DeepTiledOutputFile::numYLevels(), iVar5 < iVar6) {
      local_104 = 0;
      while (iVar5 = local_104, iVar6 = Imf_3_2::DeepTiledOutputFile::numXLevels(), iVar5 < iVar6) {
        anon_unknown_30::saveLevel
                  (in_stack_ffffffffffffff50,img_00,(int)((ulong)cVar11._M_node >> 0x20),
                   (int)cVar11._M_node);
        local_104 = local_104 + 1;
      }
      local_100 = local_100 + 1;
    }
  }
  Imf_3_2::DeepTiledOutputFile::~DeepTiledOutputFile(local_f8);
  Imf_3_2::Header::~Header((Header *)local_58);
  return;
}

Assistant:

void
saveDeepTiledImage (
    const string&    fileName,
    const Header&    hdr,
    const DeepImage& img,
    DataWindowSource dws)
{
    Header newHdr;

    for (Header::ConstIterator i = hdr.begin (); i != hdr.end (); ++i)
    {
        if (strcmp (i.name (), "dataWindow") && strcmp (i.name (), "tiles") &&
            strcmp (i.name (), "channels"))
        {
            newHdr.insert (i.name (), i.attribute ());
        }
    }

    if (hdr.hasTileDescription ())
    {
        newHdr.setTileDescription (TileDescription (
            hdr.tileDescription ().xSize,
            hdr.tileDescription ().ySize,
            img.levelMode (),
            img.levelRoundingMode ()));
    }
    else
    {
        newHdr.setTileDescription (TileDescription (
            64, // xSize
            64, // ySize
            img.levelMode (),
            img.levelRoundingMode ()));
    }

    newHdr.dataWindow () = dataWindowForFile (hdr, img, dws);

    //XXX TODO: setting the compression to, for example,  ZIP_COMPRESSION,
    //then the OpenEXR library will save the file, but later it will not be
    //able to read it.  Fix the library!

    newHdr.compression () = ZIPS_COMPRESSION;

    const DeepImageLevel& level = img.level (0, 0);

    for (DeepImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        newHdr.channels ().insert (i.name (), i.channel ().channel ());

    DeepTiledOutputFile out (fileName.c_str (), newHdr);

    switch (img.levelMode ())
    {
        case ONE_LEVEL: saveLevel (out, img, 0, 0); break;

        case MIPMAP_LEVELS:

            for (int x = 0; x < out.numLevels (); ++x)
                saveLevel (out, img, x, x);

            break;

        case RIPMAP_LEVELS:

            for (int y = 0; y < out.numYLevels (); ++y)
                for (int x = 0; x < out.numXLevels (); ++x)
                    saveLevel (out, img, x, y);

            break;

        default: assert (false);
    }
}